

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O2

Llb_Man_t * Llb_ManStart(Aig_Man_t *pAigGlo,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  Llb_Man_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Llb_Mtr_t *pLVar4;
  int iVar5;
  long lVar6;
  
  Aig_ManCleanMarkA(pAig);
  lVar6 = 1;
  p = (Llb_Man_t *)calloc(1,0x88);
  p->pAigGlo = pAigGlo;
  p->pPars = pPars;
  p->pAig = pAig;
  p_00 = Llb_ManMarkPivotNodes(pAig,pPars->fUsePivots);
  p->vVar2Obj = p_00;
  p_01 = Vec_IntAlloc(0);
  if ((long)p_00->nSize != 0) {
    iVar5 = *p_00->pArray;
    for (; lVar6 < p_00->nSize; lVar6 = lVar6 + 1) {
      iVar1 = p_00->pArray[lVar6];
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
    }
    Vec_IntFill(p_01,iVar5 + 1,-1);
    for (iVar5 = 0; iVar5 < p_00->nSize; iVar5 = iVar5 + 1) {
      iVar1 = Vec_IntEntry(p_00,iVar5);
      if (iVar1 != -1) {
        Vec_IntWriteEntry(p_01,iVar1,iVar5);
      }
    }
  }
  p->vObj2Var = p_01;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  p->vRings = pVVar2;
  Llb_ManPrepareVarMap(p);
  Llb_ManPrepareGroups(p);
  Aig_ManCleanMarkA(pAig);
  pLVar4 = Llb_MtrCreate(p);
  p->pMatrix = pLVar4;
  pLVar4->pMan = p;
  return p;
}

Assistant:

Llb_Man_t * Llb_ManStart( Aig_Man_t * pAigGlo, Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Man_t * p;
    Aig_ManCleanMarkA( pAig );
    p = ABC_CALLOC( Llb_Man_t, 1 );
    p->pAigGlo  = pAigGlo;
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->vVar2Obj = Llb_ManMarkPivotNodes( p->pAig, pPars->fUsePivots );
    p->vObj2Var = Vec_IntInvert( p->vVar2Obj, -1 );
    p->vRings   = Vec_PtrAlloc( 100 );
    Llb_ManPrepareVarMap( p );
    Llb_ManPrepareGroups( p );
    Aig_ManCleanMarkA( pAig );
    p->pMatrix = Llb_MtrCreate( p );
    p->pMatrix->pMan = p;
    return p;
}